

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void av1_highbd_quantize_b_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  int iVar1;
  tran_low_t *in_RCX;
  long in_RDX;
  intptr_t unaff_RBP;
  intptr_t in_RSI;
  tran_low_t *in_RDI;
  tran_low_t *in_R8;
  uint16_t *in_R9;
  int16_t *unaff_R12;
  int16_t *unaff_R13;
  int16_t *unaff_R14;
  int16_t *unaff_R15;
  tran_low_t *unaff_retaddr;
  undefined8 *in_stack_00000008;
  tran_low_t *in_stack_00000010;
  tran_low_t *in_stack_00000018;
  int16_t *in_stack_00000020;
  uint16_t *in_stack_00000028;
  int16_t *in_stack_00000030;
  int16_t *in_stack_00000038;
  qm_val_t *in_stack_00000040;
  qm_val_t *in_stack_00000048;
  int in_stack_00000050;
  qm_val_t *iqm_ptr;
  qm_val_t *qm_ptr;
  int16_t *in_stack_000001a0;
  int16_t *in_stack_000001a8;
  int16_t *in_stack_000001b0;
  int16_t *in_stack_000001b8;
  intptr_t in_stack_000001c0;
  tran_low_t *in_stack_000001c8;
  tran_low_t *in_stack_000009c0;
  tran_low_t *in_stack_000009c8;
  int16_t *in_stack_000009d0;
  uint16_t *in_stack_000009d8;
  int16_t *in_stack_000009e0;
  int16_t *in_stack_000009e8;
  int16_t *in_stack_00003fb8;
  int16_t *in_stack_00003fc0;
  int16_t *in_stack_00003fc8;
  int16_t *in_stack_00003fd0;
  intptr_t in_stack_00003fd8;
  tran_low_t *in_stack_00003fe0;
  tran_low_t *in_stack_00003ff0;
  tran_low_t *in_stack_00003ff8;
  int16_t *in_stack_00004000;
  uint16_t *in_stack_00004008;
  int16_t *in_stack_00004010;
  int16_t *in_stack_00004018;
  qm_val_t *in_stack_00004020;
  qm_val_t *in_stack_00004028;
  int in_stack_00004030;
  
  if (in_stack_00000010[6] == 0) {
    if ((*(long *)(in_stack_00000010 + 2) == 0) || (*(long *)(in_stack_00000010 + 4) == 0)) {
      iVar1 = *in_stack_00000010;
      if (iVar1 == 0) {
        (*aom_highbd_quantize_b)
                  (in_RDI,in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x68),
                   *(int16_t **)(in_RDX + 0x60),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
                   *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
                   (int16_t *)in_stack_00000008[1]);
      }
      else if (iVar1 == 1) {
        (*aom_highbd_quantize_b_32x32)
                  (in_RDI,in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x68),
                   *(int16_t **)(in_RDX + 0x60),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
                   *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
                   (int16_t *)in_stack_00000008[1]);
      }
      else if (iVar1 == 2) {
        (*aom_highbd_quantize_b_64x64)
                  (in_RDI,in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x68),
                   *(int16_t **)(in_RDX + 0x60),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
                   *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
                   (int16_t *)in_stack_00000008[1]);
      }
    }
    else {
      aom_highbd_quantize_b_helper_c
                (in_stack_00003fe0,in_stack_00003fd8,in_stack_00003fd0,in_stack_00003fc8,
                 in_stack_00003fc0,in_stack_00003fb8,in_stack_00003ff0,in_stack_00003ff8,
                 in_stack_00004000,in_stack_00004008,in_stack_00004010,in_stack_00004018,
                 in_stack_00004020,in_stack_00004028,in_stack_00004030);
    }
  }
  else if ((*(long *)(in_stack_00000010 + 2) == 0) || (*(long *)(in_stack_00000010 + 4) == 0)) {
    iVar1 = *in_stack_00000010;
    if (iVar1 == 0) {
      (*aom_highbd_quantize_b_adaptive)
                (in_RDI,in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x68),
                 *(int16_t **)(in_RDX + 0x60),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
                 *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
                 (int16_t *)in_stack_00000008[1]);
    }
    else if (iVar1 == 1) {
      (*aom_highbd_quantize_b_32x32_adaptive)
                (in_RDI,in_RSI,*(int16_t **)(in_RDX + 0x78),*(int16_t **)(in_RDX + 0x68),
                 *(int16_t **)(in_RDX + 0x60),*(int16_t **)(in_RDX + 0x70),in_RCX,in_R8,
                 *(int16_t **)(in_RDX + 0x80),in_R9,(int16_t *)*in_stack_00000008,
                 (int16_t *)in_stack_00000008[1]);
    }
    else if (iVar1 == 2) {
      aom_highbd_quantize_b_64x64_adaptive_sse2
                (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                 in_stack_000001a8,in_stack_000001a0,in_stack_000009c0,in_stack_000009c8,
                 in_stack_000009d0,in_stack_000009d8,in_stack_000009e0,in_stack_000009e8);
    }
  }
  else {
    aom_highbd_quantize_b_adaptive_helper_c
              (unaff_retaddr,unaff_RBP,unaff_R15,unaff_R14,unaff_R13,unaff_R12,in_stack_00000010,
               in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
               in_stack_00000038,in_stack_00000040,in_stack_00000048,in_stack_00000050);
  }
  return;
}

Assistant:

void av1_highbd_quantize_b_facade(const tran_low_t *coeff_ptr,
                                  intptr_t n_coeffs, const MACROBLOCK_PLANE *p,
                                  tran_low_t *qcoeff_ptr,
                                  tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                                  const SCAN_ORDER *sc,
                                  const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
#if !CONFIG_REALTIME_ONLY
  if (qparam->use_quant_b_adapt) {
    if (qm_ptr != NULL && iqm_ptr != NULL) {
      aom_highbd_quantize_b_adaptive_helper_c(
          coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
          p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX, eob_ptr,
          sc->scan, sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
    } else {
      switch (qparam->log_scale) {
        case 0:
          aom_highbd_quantize_b_adaptive(
              coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
              p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
              eob_ptr, sc->scan, sc->iscan);
          break;
        case 1:
          aom_highbd_quantize_b_32x32_adaptive(
              coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
              p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
              eob_ptr, sc->scan, sc->iscan);
          break;
        case 2:
          aom_highbd_quantize_b_64x64_adaptive(
              coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
              p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
              eob_ptr, sc->scan, sc->iscan);
          break;
        default: assert(0);
      }
    }
    return;
  }
#endif  // !CONFIG_REALTIME_ONLY

  if (qm_ptr != NULL && iqm_ptr != NULL) {
    aom_highbd_quantize_b_helper_c(
        coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
        p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX, eob_ptr,
        sc->scan, sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    switch (qparam->log_scale) {
      case 0:
        aom_highbd_quantize_b(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX,
                              p->quant_QTX, p->quant_shift_QTX, qcoeff_ptr,
                              dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                              sc->iscan);
        break;
      case 1:
        aom_highbd_quantize_b_32x32(
            coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
            p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
            eob_ptr, sc->scan, sc->iscan);
        break;
      case 2:
        aom_highbd_quantize_b_64x64(
            coeff_ptr, n_coeffs, p->zbin_QTX, p->round_QTX, p->quant_QTX,
            p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX,
            eob_ptr, sc->scan, sc->iscan);
        break;
      default: assert(0);
    }
  }
}